

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O2

void __thiscall Simplex::unboundedDebug(Simplex *this)

{
  longdouble lVar1;
  ulong uVar2;
  long lVar3;
  undefined8 in_R9;
  int i;
  ulong uVar4;
  int i_1;
  longdouble lVar5;
  
  fwrite("Unbounded:\n",0xb,1,_stderr);
  printObjective(this);
  fprintf(_stderr,"Pivot row = %d\n",(ulong)(uint)this->pivot_row);
  lVar5 = this->rhs[this->pivot_row];
  fprintf(_stderr,"RHS = %.3Lf\n");
  fwrite("Row: ",5,1,_stderr);
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    uVar2 = (ulong)this->n;
    if ((long)((long)this->m + uVar2) <= (long)uVar4) break;
    lVar1 = *(longdouble *)((long)this->row + lVar3);
    if ((lVar1 != (longdouble)0) || (NAN(lVar1) || NAN((longdouble)0))) {
      fprintf(_stderr,"%d:",uVar4 & 0xffffffff);
      lVar5 = *(longdouble *)((long)this->obj + lVar3);
      fprintf(_stderr,"%.3Lf/%.3Lf, ");
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x10;
  }
  for (uVar4 = 0; (long)uVar4 < (long)(int)uVar2; uVar4 = uVar4 + 1) {
    fprintf(_stderr,"%d:%d %d, ",uVar4 & 0xffffffff,(ulong)(uint)this->lb[uVar4].v,
            (ulong)(uint)this->ub[uVar4].v,in_R9,lVar5);
    uVar2 = (ulong)(uint)this->n;
  }
  return;
}

Assistant:

void Simplex::unboundedDebug() const {
	fprintf(stderr, "Unbounded:\n");
	printObjective();
	//		printTableau(true);
	fprintf(stderr, "Pivot row = %d\n", pivot_row);
	fprintf(stderr, "RHS = %.3Lf\n", rhs[pivot_row]);
	fprintf(stderr, "Row: ");
	for (int i = 0; i < n + m; i++) {
		if (row[i] == 0) {
			continue;
		}
		fprintf(stderr, "%d:", i);
		fprintf(stderr, "%.3Lf/%.3Lf, ", obj[i], row[i]);
	}
	for (int i = 0; i < n; i++) {
		fprintf(stderr, "%d:%d %d, ", i, (int)lb[i], (int)ub[i]);
	}
}